

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

Symbol __thiscall GrcSymbolTableEntry::BaseLigComponent(GrcSymbolTableEntry *this)

{
  int iVar1;
  Symbol pGVar2;
  
  do {
    pGVar2 = this;
    this = pGVar2->m_psymtbl->m_psymParent;
    iVar1 = std::__cxx11::string::compare((char *)this);
  } while (iVar1 != 0);
  return pGVar2;
}

Assistant:

Symbol GrcSymbolTableEntry::BaseLigComponent()
{
	Assert(FitsSymbolType(ksymtGlyphAttr) ||
		FitsSymbolType(ksymtSlotAttr) ||
		FitsSymbolType(ksymtNonLeafGlyphAttr));

	Symbol psymParent = ParentSymbol();
	Assert(psymParent);
	if (psymParent->m_staFieldName == "component")
		return this;
	else
		return psymParent->BaseLigComponent();
}